

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp.c
# Opt level: O2

int uv__tcp_bind(uv_tcp_t *tcp,sockaddr *addr,uint addrlen,uint flags)

{
  int iVar1;
  int *piVar2;
  int local_3c;
  uint local_30;
  int local_2c;
  int on;
  int err;
  uint flags_local;
  uint addrlen_local;
  sockaddr *addr_local;
  uv_tcp_t *tcp_local;
  
  if (((flags & 1) == 0) || (addr->sa_family == 10)) {
    on = flags;
    err = addrlen;
    _flags_local = addr;
    addr_local = (sockaddr *)tcp;
    local_2c = maybe_new_socket(tcp,(uint)addr->sa_family,0);
    tcp_local._4_4_ = local_2c;
    if (local_2c == 0) {
      local_30 = 1;
      iVar1 = setsockopt(*(int *)(addr_local[0xb].sa_data + 6),1,2,&local_30,4);
      if (iVar1 == 0) {
        if (_flags_local->sa_family == 10) {
          local_30 = (uint)((on & 1U) != 0);
          iVar1 = setsockopt(*(int *)(addr_local[0xb].sa_data + 6),0x29,0x1a,&local_30,4);
          if (iVar1 == -1) {
            piVar2 = __errno_location();
            return -*piVar2;
          }
        }
        piVar2 = __errno_location();
        *piVar2 = 0;
        local_2c = bind(*(int *)(addr_local[0xb].sa_data + 6),(sockaddr *)_flags_local,err);
        if ((local_2c == -1) && (piVar2 = __errno_location(), *piVar2 != 0x62)) {
          piVar2 = __errno_location();
          if (*piVar2 == 0x61) {
            tcp_local._4_4_ = -0x16;
          }
          else {
            piVar2 = __errno_location();
            tcp_local._4_4_ = -*piVar2;
          }
        }
        else {
          if (local_2c == -1) {
            piVar2 = __errno_location();
            local_3c = -*piVar2;
          }
          else {
            local_3c = 0;
          }
          *(int *)(addr_local[0xe].sa_data + 6) = local_3c;
          *(uint *)(addr_local[5].sa_data + 6) = *(uint *)(addr_local[5].sa_data + 6) | 0x2000;
          if (((sockaddr *)_flags_local)->sa_family == 10) {
            *(uint *)(addr_local[5].sa_data + 6) = *(uint *)(addr_local[5].sa_data + 6) | 0x400000;
          }
          tcp_local._4_4_ = 0;
        }
      }
      else {
        piVar2 = __errno_location();
        tcp_local._4_4_ = -*piVar2;
      }
    }
  }
  else {
    tcp_local._4_4_ = -0x16;
  }
  return tcp_local._4_4_;
}

Assistant:

int uv__tcp_bind(uv_tcp_t* tcp,
                 const struct sockaddr* addr,
                 unsigned int addrlen,
                 unsigned int flags) {
  int err;
  int on;

  /* Cannot set IPv6-only mode on non-IPv6 socket. */
  if ((flags & UV_TCP_IPV6ONLY) && addr->sa_family != AF_INET6)
    return UV_EINVAL;

  err = maybe_new_socket(tcp, addr->sa_family, 0);
  if (err)
    return err;

  on = 1;
  if (setsockopt(tcp->io_watcher.fd, SOL_SOCKET, SO_REUSEADDR, &on, sizeof(on)))
    return UV__ERR(errno);

#ifndef __OpenBSD__
#ifdef IPV6_V6ONLY
  if (addr->sa_family == AF_INET6) {
    on = (flags & UV_TCP_IPV6ONLY) != 0;
    if (setsockopt(tcp->io_watcher.fd,
                   IPPROTO_IPV6,
                   IPV6_V6ONLY,
                   &on,
                   sizeof on) == -1) {
#if defined(__MVS__)
      if (errno == EOPNOTSUPP)
        return UV_EINVAL;
#endif
      return UV__ERR(errno);
    }
  }
#endif
#endif

  errno = 0;
  err = bind(tcp->io_watcher.fd, addr, addrlen);
  if (err == -1 && errno != EADDRINUSE) {
    if (errno == EAFNOSUPPORT)
      /* OSX, other BSDs and SunoS fail with EAFNOSUPPORT when binding a
       * socket created with AF_INET to an AF_INET6 address or vice versa. */
      return UV_EINVAL;
    return UV__ERR(errno);
  }
  tcp->delayed_error = (err == -1) ? UV__ERR(errno) : 0;

  tcp->flags |= UV_HANDLE_BOUND;
  if (addr->sa_family == AF_INET6)
    tcp->flags |= UV_HANDLE_IPV6;

  return 0;
}